

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-make.c
# Opt level: O1

_Bool kind_is_good(object_kind *kind)

{
  wchar_t wVar1;
  _Bool _Var2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  random_value v;
  
  wVar1 = kind->tval;
  if (0x12 < (uint)wVar1) {
LAB_001a9cd9:
    _Var2 = flag_has_dbg(kind->kind_flags,4,0x15,"kind->kind_flags","KF_GOOD");
    return _Var2;
  }
  if ((0x7fc00U >> (wVar1 & 0x1fU) & 1) == 0) {
    if ((0x3e0U >> (wVar1 & 0x1fU) & 1) == 0) {
      if ((0x18U >> (wVar1 & 0x1fU) & 1) != 0) {
        return true;
      }
      goto LAB_001a9cd9;
    }
    iVar3 = randcalc((random_value)kind->to_h,0,MINIMISE);
    if (iVar3 < 0) {
      return false;
    }
    uVar5._0_4_ = (kind->to_d).base;
    uVar5._4_4_ = (kind->to_d).dice;
    uVar4._0_4_ = (kind->to_d).sides;
    uVar4._4_4_ = (kind->to_d).m_bonus;
  }
  else {
    uVar5._0_4_ = (kind->to_a).base;
    uVar5._4_4_ = (kind->to_a).dice;
    uVar4._0_4_ = (kind->to_a).sides;
    uVar4._4_4_ = (kind->to_a).m_bonus;
  }
  v.sides = (int)uVar4;
  v.m_bonus = (int)((ulong)uVar4 >> 0x20);
  v.base = (int)uVar5;
  v.dice = (int)((ulong)uVar5 >> 0x20);
  iVar3 = randcalc(v,0,MINIMISE);
  return -1 < iVar3;
}

Assistant:

bool kind_is_good(const struct object_kind *kind)
{
	/* Some item types are (almost) always good */
	switch (kind->tval)
	{
		/* Armor -- Good unless damaged */
		case TV_HARD_ARMOR:
		case TV_SOFT_ARMOR:
		case TV_DRAG_ARMOR:
		case TV_SHIELD:
		case TV_CLOAK:
		case TV_BOOTS:
		case TV_GLOVES:
		case TV_HELM:
		case TV_CROWN:
		{
			if (randcalc(kind->to_a, 0, MINIMISE) < 0) return (false);
			return true;
		}

		/* Weapons -- Good unless damaged */
		case TV_BOW:
		case TV_SWORD:
		case TV_HAFTED:
		case TV_POLEARM:
		case TV_DIGGING:
		{
			if (randcalc(kind->to_h, 0, MINIMISE) < 0) return (false);
			if (randcalc(kind->to_d, 0, MINIMISE) < 0) return (false);
			return true;
		}

		/* Ammo -- Arrows/Bolts are good */
		case TV_BOLT:
		case TV_ARROW:
		{
			return true;
		}
	}

	/* Anything with the GOOD flag */
	if (kf_has(kind->kind_flags, KF_GOOD))
		return true;

	/* Assume not good */
	return (false);
}